

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_mp3_read_pcm_frames_raw(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_uint32 mVar1;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  ma_uint32 framesToConsume;
  ma_uint64 totalFramesRead;
  ulong local_40;
  ma_uint64 local_20;
  ulong local_10;
  
  local_20 = 0;
  local_10 = in_RSI;
  while( true ) {
    if (local_10 == 0) {
      return local_20;
    }
    if (local_10 < *(uint *)(in_RDI + 0x1a5c)) {
      local_40 = local_10;
    }
    else {
      local_40 = (ulong)*(uint *)(in_RDI + 0x1a5c);
    }
    if (in_RDX != 0) {
      memcpy((void *)(in_RDX + local_20 * 2 * (ulong)*(uint *)(in_RDI + 0x1a0c)),
             (void *)(in_RDI + 0x1a60 +
                     (ulong)*(uint *)(in_RDI + 0x1a58) * 2 * (ulong)*(uint *)(in_RDI + 0x1a50)),
             (local_40 & 0xffffffff) * 2 * (ulong)*(uint *)(in_RDI + 0x1a0c));
    }
    *(ulong *)(in_RDI + 0x3e60) = (local_40 & 0xffffffff) + *(long *)(in_RDI + 0x3e60);
    *(int *)(in_RDI + 0x1a58) = (int)local_40 + *(int *)(in_RDI + 0x1a58);
    *(int *)(in_RDI + 0x1a5c) = *(int *)(in_RDI + 0x1a5c) - (int)local_40;
    local_20 = (local_40 & 0xffffffff) + local_20;
    local_10 = local_10 - (local_40 & 0xffffffff);
    if (local_10 == 0) break;
    mVar1 = ma_dr_mp3_decode_next_frame((ma_dr_mp3 *)0x203d7c);
    if (mVar1 == 0) {
      return local_20;
    }
  }
  return local_20;
}

Assistant:

static ma_uint64 ma_dr_mp3_read_pcm_frames_raw(ma_dr_mp3* pMP3, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(pMP3->onRead != NULL);
    while (framesToRead > 0) {
        ma_uint32 framesToConsume = (ma_uint32)MA_DR_MP3_MIN(pMP3->pcmFramesRemainingInMP3Frame, framesToRead);
        if (pBufferOut != NULL) {
        #if defined(MA_DR_MP3_FLOAT_OUTPUT)
            float* pFramesOutF32 = (float*)MA_DR_MP3_OFFSET_PTR(pBufferOut,          sizeof(float) * totalFramesRead                   * pMP3->channels);
            float* pFramesInF32  = (float*)MA_DR_MP3_OFFSET_PTR(&pMP3->pcmFrames[0], sizeof(float) * pMP3->pcmFramesConsumedInMP3Frame * pMP3->mp3FrameChannels);
            MA_DR_MP3_COPY_MEMORY(pFramesOutF32, pFramesInF32, sizeof(float) * framesToConsume * pMP3->channels);
        #else
            ma_int16* pFramesOutS16 = (ma_int16*)MA_DR_MP3_OFFSET_PTR(pBufferOut,          sizeof(ma_int16) * totalFramesRead                   * pMP3->channels);
            ma_int16* pFramesInS16  = (ma_int16*)MA_DR_MP3_OFFSET_PTR(&pMP3->pcmFrames[0], sizeof(ma_int16) * pMP3->pcmFramesConsumedInMP3Frame * pMP3->mp3FrameChannels);
            MA_DR_MP3_COPY_MEMORY(pFramesOutS16, pFramesInS16, sizeof(ma_int16) * framesToConsume * pMP3->channels);
        #endif
        }
        pMP3->currentPCMFrame              += framesToConsume;
        pMP3->pcmFramesConsumedInMP3Frame  += framesToConsume;
        pMP3->pcmFramesRemainingInMP3Frame -= framesToConsume;
        totalFramesRead                    += framesToConsume;
        framesToRead                       -= framesToConsume;
        if (framesToRead == 0) {
            break;
        }
        MA_DR_MP3_ASSERT(pMP3->pcmFramesRemainingInMP3Frame == 0);
        if (ma_dr_mp3_decode_next_frame(pMP3) == 0) {
            break;
        }
    }
    return totalFramesRead;
}